

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

int spectest::LaneCountFromType(Type type)

{
  uint uVar1;
  
  if (0xfffffff8 < (uint)type.enum_) {
    uVar1 = type.enum_ + I32U;
    if ((0x7bU >> (uVar1 & 0x1f) & 1) != 0) {
      return *(int *)(&DAT_00190340 + (long)(int)uVar1 * 4);
    }
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                ,0xbd,"int spectest::LaneCountFromType(Type)");
}

Assistant:

int LaneCountFromType(Type type) {
  switch (type) {
    case Type::I8: return 16;
    case Type::I16: return 8;
    case Type::I32: return 4;
    case Type::I64: return 2;
    case Type::F32: return 4;
    case Type::F64: return 2;
    default: assert(false); return 0;
  }
}